

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void bloaty::BloatyDoMain(Options *options,InputFileFactory *file_factory,RollupOutput *output)

{
  Rep *pRVar1;
  string *psVar2;
  long lVar3;
  int line;
  char *str;
  long lVar4;
  void **ppvVar5;
  string_view function;
  Bloaty bloaty;
  ReImpl re;
  Bloaty BStack_2e8;
  RE2 local_108;
  
  Bloaty::Bloaty(&BStack_2e8,file_factory,options);
  lVar4 = (long)(options->filename_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar4 == 0) {
    line = 0x8ea;
    str = "must specify at least one file";
  }
  else {
    if (0 < options->max_rows_per_level_) {
      pRVar1 = (options->filename_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      lVar3 = 0;
      do {
        Bloaty::AddFilename(&BStack_2e8,*(string **)((long)ppvVar5 + lVar3),false);
        lVar3 = lVar3 + 8;
      } while (lVar4 * 8 != lVar3);
      pRVar1 = (options->base_filename_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      lVar4 = (long)(options->base_filename_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar4 != 0) {
        lVar3 = 0;
        do {
          Bloaty::AddFilename(&BStack_2e8,*(string **)((long)ppvVar5 + lVar3),true);
          lVar3 = lVar3 + 8;
        } while (lVar4 * 8 != lVar3);
      }
      pRVar1 = (options->debug_filename_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      lVar4 = (long)(options->debug_filename_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar4 != 0) {
        lVar3 = 0;
        do {
          Bloaty::AddDebugFilename(&BStack_2e8,*(string **)((long)ppvVar5 + lVar3));
          lVar3 = lVar3 + 8;
        } while (lVar4 * 8 != lVar3);
      }
      pRVar1 = (options->source_map_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      lVar4 = (long)(options->source_map_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar4 != 0) {
        lVar3 = 0;
        do {
          Bloaty::AddSourceMapFilename(&BStack_2e8,*(string **)((long)ppvVar5 + lVar3));
          lVar3 = lVar3 + 8;
        } while (lVar4 * 8 != lVar3);
      }
      pRVar1 = (options->custom_data_source_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      lVar4 = (long)(options->custom_data_source_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar4 != 0) {
        lVar3 = 0;
        do {
          Bloaty::DefineCustomDataSource(&BStack_2e8,*(CustomDataSource **)((long)ppvVar5 + lVar3));
          lVar3 = lVar3 + 8;
        } while (lVar4 * 8 != lVar3);
      }
      pRVar1 = (options->data_source_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      lVar4 = (long)(options->data_source_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar4 != 0) {
        lVar3 = 0;
        do {
          Bloaty::AddDataSource(&BStack_2e8,*(string **)((long)ppvVar5 + lVar3));
          lVar3 = lVar3 + 8;
        } while (lVar4 * 8 != lVar3);
      }
      if (((options->_has_bits_).has_bits_[0] & 2) != 0) {
        re2::RE2::RE2(&local_108,(options->source_filter_).ptr_);
        if (local_108.error_code_ != NoError) {
          Throw("invalid regex for source_filter",0x90c);
        }
        re2::RE2::~RE2(&local_108);
      }
      verbose_level = options->verbose_level_;
      if ((options->data_source_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        if (((options->_has_bits_).has_bits_[0] & 1) != 0) {
          psVar2 = (options->disassemble_function_).ptr_;
          function._M_str = (psVar2->_M_dataplus)._M_p;
          function._M_len = psVar2->_M_string_length;
          Bloaty::DisassembleFunction(&BStack_2e8,function,options,output);
        }
      }
      else {
        Bloaty::ScanAndRollup(&BStack_2e8,options,output);
      }
      std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
      ~unique_ptr(&BStack_2e8.arena_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&BStack_2e8.sourcemap_files_._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&BStack_2e8.debug_files_._M_t);
      std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
      ~vector(&BStack_2e8.base_files_);
      std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
      ~vector(&BStack_2e8.input_files_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&BStack_2e8.source_names_);
      if (BStack_2e8.sources_.
          super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(BStack_2e8.sources_.
                        super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)BStack_2e8.sources_.
                              super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)BStack_2e8.sources_.
                              super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>_>
      ::~_Rb_tree(&BStack_2e8.all_known_sources_._M_t);
      Options::~Options(&BStack_2e8.options_);
      return;
    }
    line = 0x8ee;
    str = "max_rows_per_level must be at least 1";
  }
  Throw(str,line);
}

Assistant:

void BloatyDoMain(const Options& options, const InputFileFactory& file_factory,
                  RollupOutput* output) {
  bloaty::Bloaty bloaty(file_factory, options);

  if (options.filename_size() == 0) {
    THROW("must specify at least one file");
  }

  if (options.max_rows_per_level() < 1) {
    THROW("max_rows_per_level must be at least 1");
  }

  for (auto& filename : options.filename()) {
    bloaty.AddFilename(filename, false);
  }

  for (auto& base_filename : options.base_filename()) {
    bloaty.AddFilename(base_filename, true);
  }

  for (auto& debug_filename : options.debug_filename()) {
    bloaty.AddDebugFilename(debug_filename);
  }

  for (auto& sourcemap : options.source_map()) {
    bloaty.AddSourceMapFilename(sourcemap);
  }

  for (const auto& custom_data_source : options.custom_data_source()) {
    bloaty.DefineCustomDataSource(custom_data_source);
  }

  for (const auto& data_source : options.data_source()) {
    bloaty.AddDataSource(data_source);
  }

  if (options.has_source_filter()) {
    ReImpl re(options.source_filter());
    if (!re.ok()) {
      THROW("invalid regex for source_filter");
    }
  }

  verbose_level = options.verbose_level();

  if (options.data_source_size() > 0) {
    bloaty.ScanAndRollup(options, output);
  } else if (options.has_disassemble_function()) {
    bloaty.DisassembleFunction(options.disassemble_function(), options, output);
  }
}